

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRError.h
# Opt level: O2

char * __thiscall MinVR::VRError::what(VRError *this)

{
  char *__dest;
  string emsg;
  string local_50;
  string local_30;
  
  _errorMessage_abi_cxx11_(&local_50,this);
  __dest = (char *)malloc(local_50._M_string_length + 2);
  _errorMessage_abi_cxx11_(&local_30,this);
  strcpy(__dest,local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return __dest;
}

Assistant:

virtual const char* what() const throw (){
    std::string emsg = _errorMessage();
    char* out = (char*)malloc(emsg.size() + 2);
    strcpy(out, _errorMessage().c_str());
    return out;
  }